

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int make_boot_catalog(archive_write *a)

{
  void *pvVar1;
  uint16_t uVar2;
  int iVar3;
  uchar *__s;
  uchar *puVar4;
  archive_write *in_RDI;
  uint16_t *wp;
  uint16_t sum;
  uchar *p;
  uchar *block;
  iso9660_conflict *iso9660;
  uint32_t in_stack_ffffffffffffffcc;
  uchar *p_00;
  undefined6 in_stack_ffffffffffffffd8;
  short sVar5;
  
  pvVar1 = in_RDI->format_data;
  __s = wb_buffptr(in_RDI);
  memset(__s,0,0x800);
  *__s = '\x01';
  __s[1] = *(uchar *)((long)pvVar1 + 0x10348);
  __s[3] = '\0';
  __s[2] = '\0';
  if (*(long *)((long)pvVar1 + 0x10358) != 0) {
    strncpy((char *)(__s + 4),*(char **)((long)pvVar1 + 0x10350),0x17);
  }
  __s[0x1b] = '\0';
  __s[0x1d] = '\0';
  __s[0x1c] = '\0';
  __s[0x1e] = 'U';
  __s[0x1f] = 0xaa;
  sVar5 = 0;
  p_00 = __s;
  while (p_00 < __s + 0x20) {
    puVar4 = p_00 + 2;
    uVar2 = archive_le16dec(p_00);
    sVar5 = sVar5 + uVar2;
    p_00 = puVar4;
  }
  set_num_721(p_00,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
  __s[0x20] = 0x88;
  __s[0x21] = *(uchar *)((long)pvVar1 + 0x10368);
  uVar2 = (uint16_t)(in_stack_ffffffffffffffcc >> 0x10);
  if (*(char *)((long)pvVar1 + 0x10368) == '\0') {
    set_num_721(p_00,uVar2);
  }
  else {
    set_num_721(p_00,uVar2);
  }
  __s[0x24] = *(uchar *)((long)pvVar1 + 0x10369);
  __s[0x25] = '\0';
  uVar2 = (uint16_t)(in_stack_ffffffffffffffcc >> 0x10);
  if (*(char *)((long)pvVar1 + 0x10368) == '\0') {
    set_num_721(p_00,uVar2);
  }
  else {
    set_num_721(p_00,uVar2);
  }
  set_num_731(p_00,in_stack_ffffffffffffffcc);
  memset(__s + 0x2c,0,0x14);
  iVar3 = wb_consume((archive_write *)CONCAT26(sVar5,in_stack_ffffffffffffffd8),(size_t)p_00);
  return iVar3;
}

Assistant:

static int
make_boot_catalog(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	unsigned char *block;
	unsigned char *p;
	uint16_t sum, *wp;

	block = wb_buffptr(a);
	memset(block, 0, LOGICAL_BLOCK_SIZE);
	p = block;
	/*
	 * Validation Entry
	 */
	/* Header ID */
	p[0] = 1;
	/* Platform ID */
	p[1] = iso9660->el_torito.platform_id;
	/* Reserved */
	p[2] = p[3] = 0;
	/* ID */
	if (archive_strlen(&(iso9660->el_torito.id)) > 0)
		strncpy((char *)p+4, iso9660->el_torito.id.s, 23);
	p[27] = 0;
	/* Checksum */
	p[28] = p[29] = 0;
	/* Key */
	p[30] = 0x55;
	p[31] = 0xAA;

	sum = 0;
	wp = (uint16_t *)block;
	while (wp < (uint16_t *)&block[32])
		sum += archive_le16dec(wp++);
	set_num_721(&block[28], (~sum) + 1);

	/*
	 * Initial/Default Entry
	 */
	p = &block[32];
	/* Boot Indicator */
	p[0] = 0x88;
	/* Boot media type */
	p[1] = iso9660->el_torito.media_type;
	/* Load Segment */
	if (iso9660->el_torito.media_type == BOOT_MEDIA_NO_EMULATION)
		set_num_721(&p[2], iso9660->el_torito.boot_load_seg);
	else
		set_num_721(&p[2], 0);
	/* System Type */
	p[4] = iso9660->el_torito.system_type;
	/* Unused */
	p[5] = 0;
	/* Sector Count */
	if (iso9660->el_torito.media_type == BOOT_MEDIA_NO_EMULATION)
		set_num_721(&p[6], iso9660->el_torito.boot_load_size);
	else
		set_num_721(&p[6], 1);
	/* Load RBA */
	set_num_731(&p[8],
	    iso9660->el_torito.boot->file->content.location);
	/* Unused */
	memset(&p[12], 0, 20);

	return (wb_consume(a, LOGICAL_BLOCK_SIZE));
}